

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pong.cpp
# Opt level: O3

Am_Wrapper * score_as_string_proc(Am_Object *self)

{
  char cVar1;
  int iVar2;
  Am_Value *this;
  Am_Wrapper *pAVar3;
  Am_String str;
  char line [100];
  ostrstream oss;
  Am_String local_1f0 [8];
  char local_1e8 [112];
  ostrstream local_178 [360];
  
  this = (Am_Value *)Am_Object::Get((ushort)self,(ulong)SCORE);
  iVar2 = Am_Value::operator_cast_to_int(this);
  std::ostrstream::ostrstream(local_178,local_1e8,100,_S_out);
  cVar1 = std::ostream::operator<<((ostream *)local_178,iVar2);
  std::ostream::put(cVar1);
  Am_String::Am_String(local_1f0,local_1e8,true);
  pAVar3 = Am_String::operator_cast_to_Am_Wrapper_(local_1f0);
  Am_String::~Am_String(local_1f0);
  std::ostrstream::~ostrstream(local_178);
  return pAVar3;
}

Assistant:

Am_Define_String_Formula(score_as_string)
{
  int score = self.Get(SCORE);
  char line[100];
  OSTRSTREAM_CONSTR(oss, line, 100, ios::out);
  oss << score << ends;
  OSTRSTREAM_COPY(oss, line, 100);
  Am_String str = line;
  return str;
}